

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::IStreamingReporter::listTags
          (IStreamingReporter *this,vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *tags,
          IConfig *config)

{
  size_type *this_00;
  pointer pTVar1;
  int iVar2;
  ReusableStringStream *this_01;
  ostream *poVar3;
  char *pcVar4;
  pointer pTVar5;
  ReusableStringStream rss;
  Column local_e0;
  string str;
  Column wrapper;
  string local_50;
  
  iVar2 = (*config->_vptr_IConfig[0xe])(config);
  pcVar4 = "All available tags:\n";
  if ((char)iVar2 != '\0') {
    pcVar4 = "Tags for matching test cases:\n";
  }
  std::operator<<((ostream *)&std::cout,pcVar4);
  pTVar1 = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar5 = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
                super__Vector_impl_data._M_start; pTVar5 != pTVar1; pTVar5 = pTVar5 + 1) {
    ReusableStringStream::ReusableStringStream(&rss);
    std::operator<<(rss.m_oss,"  ");
    *(undefined8 *)(rss.m_oss + *(long *)(*(long *)rss.m_oss + -0x18) + 0x10) = 2;
    this_01 = ReusableStringStream::operator<<(&rss,&pTVar5->count);
    ReusableStringStream::operator<<(this_01,(char (*) [3])0x1e2685);
    std::__cxx11::stringbuf::str();
    TagInfo::all_abi_cxx11_(&local_50,pTVar5);
    TextFlow::Column::Column(&local_e0,&local_50);
    local_e0.m_initialIndent = 0;
    local_e0.m_indent = str._M_string_length;
    local_e0.m_width = 0x46;
    TextFlow::Column::Column(&wrapper,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_50);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&str);
    TextFlow::operator<<(poVar3,&wrapper);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&wrapper);
    std::__cxx11::string::~string((string *)&str);
    ReusableStringStream::~ReusableStringStream(&rss);
  }
  pTVar5 = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"tag",(allocator<char> *)&str);
  wrapper.m_string._M_dataplus._M_p = (pointer)(((long)pTVar1 - (long)pTVar5) / 0x38);
  this_00 = &wrapper.m_string._M_string_length;
  std::__cxx11::string::string((string *)this_00,(string *)&local_e0);
  Catch::operator<<((ostream *)&std::cout,(pluralise *)&wrapper);
  poVar3 = std::operator<<((ostream *)&std::cout,'\n');
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

void IStreamingReporter::listTags(std::vector<TagInfo> const &tags, IConfig const &config) {
        if (config.hasTestFilters()) {
            Catch::cout() << "Tags for matching test cases:\n";
        }
        else {
            Catch::cout() << "All available tags:\n";
        }

        for (auto const &tagCount : tags) {
            ReusableStringStream rss;
            rss << "  " << std::setw(2) << tagCount.count << "  ";
            auto str = rss.str();
            auto wrapper = TextFlow::Column(tagCount.all())
                .initialIndent(0)
                .indent(str.size())
                .width(CATCH_CONFIG_CONSOLE_WIDTH - 10);
            Catch::cout() << str << wrapper << '\n';
        }
        Catch::cout() << pluralise(tags.size(), "tag") << '\n' << std::endl;
    }